

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O0

int __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  TPZQuadSphere<pzgeom::TPZGeoQuad> *in_RDI;
  string *in_stack_ffffffffffffff70;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  TPZQuadSphere<pzgeom::TPZGeoQuad> *in_stack_ffffffffffffff90;
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  uVar1 = Hash(in_stack_ffffffffffffff70);
  iVar2 = TPZGeoEl::ClassId((TPZGeoEl *)0x17b3ae6);
  pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>::TPZQuadSphere(in_RDI);
  iVar3 = pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>::ClassId(in_stack_ffffffffffffff90);
  pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>::~TPZQuadSphere
            ((TPZQuadSphere<pzgeom::TPZGeoQuad> *)0x17b3b33);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return uVar1 ^ iVar2 * 2 ^ iVar3 << 2;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}